

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExprParserHelper.cxx
# Opt level: O2

int __thiscall cmExprParserHelper::ParseString(cmExprParserHelper *this,char *str,int verb)

{
  int iVar1;
  ostream *poVar2;
  string e;
  char local_d8 [32];
  yyscan_t yyscanner;
  char *local_50;
  size_type local_48;
  char local_40 [8];
  undefined8 uStack_38;
  
  if (str == (char *)0x0) {
    iVar1 = 0;
  }
  else {
    this->Verbose = verb;
    std::__cxx11::string::assign((char *)&this->InputBuffer);
    this->InputBufferPos = 0;
    this->CurrentLine = 0;
    this->Result = 0;
    cmExpr_yylex_init(&yyscanner);
    cmExpr_yyset_extra((cmCTestResourceGroupsLexerHelper *)this,yyscanner);
    iVar1 = cmExpr_yyparse(yyscanner);
    if (iVar1 != 0) {
      local_d8[0] = '.';
      cmStrCat<char_const(&)[31],std::__cxx11::string&,char_const(&)[4],std::__cxx11::string&,char>
                (&e,(char (*) [31])"cannot parse the expression: \"",&this->InputBuffer,
                 (char (*) [4])0x738aef,&this->ErrorString,local_d8);
      local_50 = local_40;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)e._M_dataplus._M_p == &e.field_2) {
        uStack_38 = e.field_2._8_8_;
      }
      else {
        local_50 = e._M_dataplus._M_p;
      }
      local_48 = e._M_string_length;
      e._M_string_length = 0;
      e.field_2._M_local_buf[0] = '\0';
      e._M_dataplus._M_p = (pointer)&e.field_2;
      std::__cxx11::string::operator=((string *)&this->ErrorString,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&e);
    }
    cmExpr_yylex_destroy(yyscanner);
    iVar1 = 0;
    if ((this->ErrorString)._M_string_length == 0) {
      iVar1 = 1;
      if (this->Verbose != 0) {
        poVar2 = std::operator<<((ostream *)&std::cerr,"Expanding [");
        poVar2 = std::operator<<(poVar2,str);
        poVar2 = std::operator<<(poVar2,"] produced: [");
        poVar2 = std::ostream::_M_insert<long>((long)poVar2);
        poVar2 = std::operator<<(poVar2,"]");
        std::endl<char,std::char_traits<char>>(poVar2);
      }
    }
  }
  return iVar1;
}

Assistant:

int cmExprParserHelper::ParseString(const char* str, int verb)
{
  if (!str) {
    return 0;
  }
  // printf("Do some parsing: %s\n", str);

  this->Verbose = verb;
  this->InputBuffer = str;
  this->InputBufferPos = 0;
  this->CurrentLine = 0;

  this->Result = 0;

  yyscan_t yyscanner;
  cmExpr_yylex_init(&yyscanner);
  cmExpr_yyset_extra(this, yyscanner);

  try {
    int res = cmExpr_yyparse(yyscanner);
    if (res != 0) {
      std::string e =
        cmStrCat("cannot parse the expression: \"", this->InputBuffer,
                 "\": ", this->ErrorString, '.');
      this->SetError(std::move(e));
    }
  } catch (std::runtime_error const& fail) {
    std::string e = cmStrCat("cannot evaluate the expression: \"",
                             this->InputBuffer, "\": ", fail.what(), '.');
    this->SetError(std::move(e));
  } catch (std::out_of_range const&) {
    std::string e = "cannot evaluate the expression: \"" + this->InputBuffer +
      "\": a numeric value is out of range.";
    this->SetError(std::move(e));
  } catch (...) {
    std::string e =
      "cannot parse the expression: \"" + this->InputBuffer + "\".";
    this->SetError(std::move(e));
  }
  cmExpr_yylex_destroy(yyscanner);
  if (!this->ErrorString.empty()) {
    return 0;
  }

  if (this->Verbose) {
    std::cerr << "Expanding [" << str << "] produced: [" << this->Result << "]"
              << std::endl;
  }
  return 1;
}